

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O3

uint Extra_CountCofactorMinterms(DdManager *dd,DdNode *bFunc,DdNode *bVarsCof,DdNode *bVarsAll)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  byte bVar4;
  uint uVar5;
  DdNode *pDVar6;
  ulong uVar7;
  int iVar8;
  DdNode *pDVar9;
  uint uVar10;
  DdNode *bFunc_00;
  int iVar11;
  DdNode *pDVar12;
  int iVar13;
  DdNode *bFunc_01;
  ulong uVar14;
  
  uVar14 = ((long)bFunc * 0xc00005 + (ulong)s_Signature) % 0xc7a9;
  uVar7 = (ulong)(uint)((int)uVar14 << 4);
  if (*(uint *)((long)&HHTable1[0].Sign + uVar7) == s_Signature) {
    do {
      if (HHTable1[uVar14].Arg1 == bFunc) {
        return 0;
      }
      uVar10 = ((int)uVar14 + 1U) % 0xc7a9;
      uVar14 = (ulong)uVar10;
      uVar7 = (ulong)(uVar10 << 4);
    } while (*(uint *)((long)&HHTable1[0].Sign + uVar7) == s_Signature);
    uVar14 = (ulong)uVar10;
  }
  pDVar9 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  piVar3 = dd->perm;
  iVar1 = piVar3[pDVar9->index];
  if (s_EncodingVarsLevel <= iVar1) {
    bVar4 = (byte)s_MultiStart & 0x1f;
    *(uint *)((long)&HHTable1[0].Sign + uVar7) = s_Signature;
    *(DdNode **)((long)&HHTable1[0].Arg1 + uVar7) = bFunc;
    uVar10 = Extra_CountMintermsSimple(bFunc,1 << bVar4);
    return uVar10;
  }
  pDVar6 = (DdNode *)((ulong)bVarsCof & 0xfffffffffffffffe);
  iVar8 = 0x7fffffff;
  if ((ulong)pDVar6->index != 0x7fffffff) {
    iVar8 = piVar3[pDVar6->index];
  }
  iVar2 = piVar3[bVarsAll->index];
  iVar13 = iVar8;
  if (iVar1 < iVar8) {
    iVar13 = iVar1;
  }
  iVar11 = iVar2;
  if (iVar13 < iVar2) {
    iVar11 = iVar13;
  }
  if ((iVar13 < iVar2) && (iVar11 == iVar1 || iVar11 == iVar8)) {
    __assert_fail("!( LevelTop == LevelF || LevelTop == LevelC ) || LevelTop == LevelA",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddCas.c"
                  ,0x3d1,
                  "unsigned int Extra_CountCofactorMinterms(DdManager *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  bFunc_00 = bFunc;
  bFunc_01 = bFunc;
  if (iVar11 == iVar1) {
    bFunc_00 = (pDVar9->type).kids.E;
    if (pDVar9 == bFunc) {
      bFunc_01 = (pDVar9->type).kids.T;
    }
    else {
      bFunc_00 = (DdNode *)((ulong)bFunc_00 ^ 1);
      bFunc_01 = (DdNode *)((ulong)(pDVar9->type).kids.T ^ 1);
    }
  }
  if (iVar11 != iVar8) {
    pDVar9 = (DdNode *)((ulong)dd->one ^ 1);
    if (bFunc_00 == pDVar9) {
      uVar10 = 0;
    }
    else {
      uVar10 = Extra_CountCofactorMinterms(dd,bFunc_00,bVarsCof,(bVarsAll->type).kids.T);
      pDVar9 = (DdNode *)((ulong)dd->one ^ 1);
    }
    if (bFunc_01 != pDVar9) {
      uVar5 = Extra_CountCofactorMinterms(dd,bFunc_01,bVarsCof,(bVarsAll->type).kids.T);
      uVar10 = uVar10 + uVar5;
    }
    goto LAB_00805afe;
  }
  pDVar9 = (pDVar6->type).kids.E;
  if (pDVar6 == bVarsCof) {
    pDVar6 = (pDVar6->type).kids.T;
  }
  else {
    pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
    pDVar6 = (DdNode *)((ulong)(pDVar6->type).kids.T ^ 1);
  }
  pDVar12 = (DdNode *)((ulong)dd->one ^ 1);
  if (pDVar6 == pDVar12) {
    if (bFunc_00 == pDVar6) goto LAB_00805afc;
    pDVar12 = (bVarsAll->type).kids.T;
  }
  else {
    if (bFunc_01 == pDVar12) {
LAB_00805afc:
      uVar10 = 0;
      goto LAB_00805afe;
    }
    pDVar12 = (bVarsAll->type).kids.T;
    pDVar9 = pDVar6;
    bFunc_00 = bFunc_01;
  }
  uVar10 = Extra_CountCofactorMinterms(dd,bFunc_00,pDVar9,pDVar12);
LAB_00805afe:
  uVar7 = uVar14 * 0x10;
  uVar5 = HHTable1[uVar14].Sign;
  while (uVar5 == s_Signature) {
    uVar5 = ((int)uVar14 + 1U) % 0xc7a9;
    uVar14 = (ulong)uVar5;
    uVar7 = (ulong)(uVar5 << 4);
    uVar5 = *(uint *)((long)&HHTable1[0].Sign + uVar7);
  }
  *(uint *)((long)&HHTable1[0].Sign + uVar7) = s_Signature;
  *(DdNode **)((long)&HHTable1[0].Arg1 + uVar7) = bFunc;
  return uVar10;
}

Assistant:

unsigned Extra_CountCofactorMinterms( DdManager * dd, DdNode * bFunc, DdNode * bVarsCof, DdNode * bVarsAll )
// this function computes how many minterms depending on the encoding variables
// are there in the cofactor of bFunc w.r.t. variables bVarsCof
// bFunc is assumed to depend on variables s_VarsAll
// the variables s_VarsAll should be ordered above the encoding variables
{
    unsigned HKey;
    DdNode * bFuncR;

    // if the function is zero, there are no minterms
//  if ( bFunc == b0 )
//      return 0;

//  if ( st__lookup(Visited, (char*)bFunc, NULL) )
//      return 0;

//  HKey = hashKey2c( s_Signature, bFuncR );
//  if ( HHTable1[HKey].Sign == s_Signature && HHTable1[HKey].Arg1 == bFuncR ) // this node is visited
//      return 0;


    // check the hash-table 
    bFuncR = Cudd_Regular(bFunc);
//  HKey = hashKey2( s_Signature, bFuncR, _TABLESIZE_COF );
    HKey = hashKey2( s_Signature, bFunc, _TABLESIZE_COF );
    for ( ;  HHTable1[HKey].Sign == s_Signature; HKey = (HKey+1) % _TABLESIZE_COF )
//      if ( HHTable1[HKey].Arg1 == bFuncR ) // this node is visited
        if ( HHTable1[HKey].Arg1 == bFunc ) // this node is visited
            return 0;


    // if the function is already the code
    if ( dd->perm[bFuncR->index] >= s_EncodingVarsLevel )
    {
//      st__insert(Visited, (char*)bFunc, NULL);

//      HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;

        assert( HHTable1[HKey].Sign != s_Signature );
        HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;
        HHTable1[HKey].Arg1 = bFunc;

        return Extra_CountMintermsSimple( bFunc, (1<<s_MultiStart) );
    }
    else
    {
        DdNode * bFunc0,    * bFunc1;
        DdNode * bVarsCof0, * bVarsCof1;
        DdNode * bVarsCofR = Cudd_Regular(bVarsCof);
        unsigned Res;

        // get the levels
        int LevelF = dd->perm[bFuncR->index];
        int LevelC = cuddI(dd,bVarsCofR->index);
        int LevelA = dd->perm[bVarsAll->index];

        int LevelTop = LevelF;

        if ( LevelTop > LevelC )
             LevelTop = LevelC;

        if ( LevelTop > LevelA )
             LevelTop = LevelA;

        // the top var in the function or in cofactoring vars always belongs to the set of all vars
        assert( !( LevelTop == LevelF || LevelTop == LevelC ) || LevelTop == LevelA );

        // cofactor the function
        if ( LevelTop == LevelF )
        {
            if ( bFuncR != bFunc ) // bFunc is complemented 
            {
                bFunc0 = Cudd_Not( cuddE(bFuncR) );
                bFunc1 = Cudd_Not( cuddT(bFuncR) );
            }
            else
            {
                bFunc0 = cuddE(bFuncR);
                bFunc1 = cuddT(bFuncR);
            }
        }
        else // bVars is higher in the variable order 
            bFunc0 = bFunc1 = bFunc;

        // cofactor the cube
        if ( LevelTop == LevelC )
        {
            if ( bVarsCofR != bVarsCof ) // bFunc is complemented 
            {
                bVarsCof0 = Cudd_Not( cuddE(bVarsCofR) );
                bVarsCof1 = Cudd_Not( cuddT(bVarsCofR) );
            }
            else
            {
                bVarsCof0 = cuddE(bVarsCofR);
                bVarsCof1 = cuddT(bVarsCofR);
            }
        }
        else // bVars is higher in the variable order 
            bVarsCof0 = bVarsCof1 = bVarsCof;

        // there are two cases: 
        // (1) the top variable belongs to the cofactoring variables
        // (2) the top variable does not belong to the cofactoring variables

        // (1) the top variable belongs to the cofactoring variables
        Res = 0;
        if ( LevelTop == LevelC )
        {
            if ( bVarsCof1 == b0 ) // this is a negative cofactor
            {
                if ( bFunc0 != b0 )
                Res = Extra_CountCofactorMinterms( dd, bFunc0, bVarsCof0, cuddT(bVarsAll) );
            }
            else                        // this is a positive cofactor
            {
                if ( bFunc1 != b0 )
                Res = Extra_CountCofactorMinterms( dd, bFunc1, bVarsCof1, cuddT(bVarsAll) );
            }
        }
        else
        {
            if ( bFunc0 != b0 )
            Res += Extra_CountCofactorMinterms( dd, bFunc0, bVarsCof0, cuddT(bVarsAll) );
            
            if ( bFunc1 != b0 )
            Res += Extra_CountCofactorMinterms( dd, bFunc1, bVarsCof1, cuddT(bVarsAll) );
        }

//      st__insert(Visited, (char*)bFunc, NULL);

//      HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;

        // skip through the entries with the same signatures 
        // (these might have been created at the time of recursive calls)
        for ( ; HHTable1[HKey].Sign == s_Signature; HKey = (HKey+1) % _TABLESIZE_COF );
        assert( HHTable1[HKey].Sign != s_Signature );
        HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;
        HHTable1[HKey].Arg1 = bFunc;

        return Res;
    }
}